

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void cfd::core::ConfidentialValue::CheckVersion(uint8_t version)

{
  CfdException *this;
  uint8_t version_local;
  allocator local_39;
  undefined1 local_38 [32];
  
  if ((version & 0xf6) == 0) {
    return;
  }
  local_38._0_8_ = "cfdcore_elements_transaction.cpp";
  local_38._8_4_ = 0x252;
  local_38._16_8_ = "CheckVersion";
  version_local = version;
  logger::warn<unsigned_char&>
            ((CfdSourceLocation *)local_38,"Value version Invalid. version={}.",&version_local);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"Value version Invalid.",&local_39);
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_38);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialValue::CheckVersion(uint8_t version) {
  if ((version != 0) && (version != 1) && (version != 0x08) &&
      (version != 0x09)) {
    warn(CFD_LOG_SOURCE, "Value version Invalid. version={}.", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Value version Invalid.");
  }
}